

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::RenderVertexStorageImage::prepare
          (RenderVertexStorageImage *this,PrepareRenderPassContext *context)

{
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  RefData<vk::Handle<(vk::HandleType)14>_> data_00;
  RefData<vk::Handle<(vk::HandleType)21>_> data_01;
  RefData<vk::Handle<(vk::HandleType)22>_> data_02;
  RefData<vk::Handle<(vk::HandleType)13>_> data_03;
  deUint32 viewPortWidth;
  deUint32 viewPortHeight;
  Context *pCVar1;
  DeviceInterface *deviceInterface;
  VkDevice device_00;
  VkRenderPass VVar2;
  ProgramCollection<vk::ProgramBinary> *pPVar3;
  ProgramBinary *pPVar4;
  Handle<(vk::HandleType)14> *vertexShaderModule_00;
  Handle<(vk::HandleType)14> *fragmentShaderModule_00;
  Handle<(vk::HandleType)19> *pHVar5;
  Handle<(vk::HandleType)21> *pHVar6;
  Handle<(vk::HandleType)13> *pHVar7;
  Handle<(vk::HandleType)22> *pHVar8;
  undefined4 local_3a0 [2];
  VkWriteDescriptorSet write;
  VkDescriptorImageInfo imageInfo;
  RefData<vk::Handle<(vk::HandleType)13>_> local_328;
  undefined1 local_308 [8];
  VkImageViewCreateInfo createInfo_1;
  RefData<vk::Handle<(vk::HandleType)22>_> local_298;
  undefined1 local_278 [8];
  VkDescriptorSetAllocateInfo allocateInfo;
  VkDescriptorSetLayout layout;
  RefData<vk::Handle<(vk::HandleType)21>_> local_228;
  undefined1 local_208 [8];
  VkDescriptorPoolCreateInfo createInfo;
  VkDescriptorPoolSize poolSizes;
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  local_1b8;
  VkRenderPass local_1a0;
  undefined1 auStack_198 [8];
  VkDescriptorSetLayoutBinding binding;
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  bindings;
  string local_160;
  Move<vk::Handle<(vk::HandleType)14>_> local_140;
  RefData<vk::Handle<(vk::HandleType)14>_> local_120;
  undefined1 local_100 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fragmentShaderModule;
  allocator<char> local_c9;
  string local_c8;
  Move<vk::Handle<(vk::HandleType)14>_> local_a8;
  RefData<vk::Handle<(vk::HandleType)14>_> local_88;
  undefined1 local_68 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vertexShaderModule;
  deUint32 subpass;
  VkRenderPass renderPass;
  VkDevice device;
  DeviceInterface *vkd;
  PrepareRenderPassContext *context_local;
  RenderVertexStorageImage *this_local;
  
  pCVar1 = PrepareRenderPassContext::getContext(context);
  deviceInterface = Context::getDeviceInterface(pCVar1);
  pCVar1 = PrepareRenderPassContext::getContext(context);
  device_00 = Context::getDevice(pCVar1);
  VVar2 = PrepareRenderPassContext::getRenderPass(context);
  vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator._4_4_
       = 0;
  pPVar3 = PrepareRenderPassContext::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"storage-image.vert",&local_c9);
  pPVar4 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,&local_c8);
  ::vk::createShaderModule(&local_a8,deviceInterface,device_00,pPVar4,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_88,(Move *)&local_a8);
  data.deleter.m_deviceIface._0_4_ = (int)local_88.deleter.m_deviceIface;
  data.object.m_internal = local_88.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_88.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_88.deleter.m_device;
  data.deleter.m_allocator = local_88.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_68,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  pPVar3 = PrepareRenderPassContext::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"render-white.frag",
             (allocator<char> *)
             ((long)&bindings.
                     super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pPVar4 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,&local_160);
  ::vk::createShaderModule(&local_140,deviceInterface,device_00,pPVar4,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_120,(Move *)&local_140);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_120.deleter.m_deviceIface;
  data_00.object.m_internal = local_120.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_120.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_120.deleter.m_device;
  data_00.deleter.m_allocator = local_120.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_100,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&bindings.
                     super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  vector((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
          *)&binding.pImmutableSamplers);
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  auStack_198._0_4_ = 0;
  auStack_198._4_4_ = VK_DESCRIPTOR_TYPE_STORAGE_IMAGE;
  binding.binding = 1;
  binding.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  push_back((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
             *)&binding.pImmutableSamplers,(value_type *)auStack_198);
  local_1a0 = VVar2;
  vertexShaderModule_00 =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                 ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_68);
  fragmentShaderModule_00 =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                 ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_100);
  viewPortWidth = PrepareRenderPassContext::getTargetWidth(context);
  viewPortHeight = PrepareRenderPassContext::getTargetHeight(context);
  local_1b8.
  super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::vector(&local_1b8);
  poolSizes.type = VK_DESCRIPTOR_TYPE_SAMPLER;
  poolSizes.descriptorCount = 0;
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::vector((vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
            *)&poolSizes);
  createPipelineWithResources
            (deviceInterface,device_00,local_1a0,0,vertexShaderModule_00,fragmentShaderModule_00,
             viewPortWidth,viewPortHeight,&local_1b8,
             (vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
              *)&poolSizes,
             (vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
              *)&binding.pImmutableSamplers,VK_PRIMITIVE_TOPOLOGY_POINT_LIST,0,
             (VkPushConstantRange *)0x0,&this->m_resources);
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::~vector((vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
             *)&poolSizes);
  std::
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::~vector(&local_1b8);
  createInfo.pPoolSizes = (VkDescriptorPoolSize *)0x100000003;
  local_208._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
  createInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  createInfo._4_4_ = 0;
  createInfo.pNext._0_4_ = 1;
  createInfo.pNext._4_4_ = 1;
  createInfo.flags = 1;
  createInfo._24_8_ = &createInfo.pPoolSizes;
  ::vk::createDescriptorPool
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&layout,deviceInterface,device_00,
             (VkDescriptorPoolCreateInfo *)local_208,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_228,(Move *)&layout);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_228.deleter.m_deviceIface;
  data_01.object.m_internal = local_228.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_228.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_228.deleter.m_device;
  data_01.deleter.m_allocator = local_228.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
            (&this->m_descriptorPool,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&layout);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     (&(this->m_resources).descriptorSetLayout.
                       super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  allocateInfo.pSetLayouts = (VkDescriptorSetLayout *)pHVar5->m_internal;
  local_278._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  allocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocateInfo._4_4_ = 0;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                     (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  allocateInfo.pNext = (void *)pHVar6->m_internal;
  allocateInfo.descriptorPool.m_internal._0_4_ = 1;
  allocateInfo._24_8_ = &allocateInfo.pSetLayouts;
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&createInfo_1.subresourceRange.layerCount,
             deviceInterface,device_00,(VkDescriptorSetAllocateInfo *)local_278);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_298,(Move *)&createInfo_1.subresourceRange.layerCount);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_298.deleter.m_deviceIface;
  data_02.object.m_internal = local_298.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_298.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_298.deleter.m_device;
  data_02.deleter.m_pool.m_internal = local_298.deleter.m_pool.m_internal;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::operator=(&this->m_descriptorSet,data_02)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&createInfo_1.subresourceRange.layerCount);
  local_308._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  createInfo_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  createInfo_1._4_4_ = 0;
  createInfo_1.pNext._0_4_ = 0;
  createInfo_1._16_8_ = PrepareRenderPassContext::getImage(context);
  createInfo_1.image.m_internal._0_4_ = 1;
  createInfo_1.image.m_internal._4_4_ = 0x25;
  createInfo_1._32_16_ = ::vk::makeComponentMappingRGBA();
  createInfo_1.components.b = VK_COMPONENT_SWIZZLE_ZERO;
  createInfo_1.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
  createInfo_1.subresourceRange.aspectMask = 1;
  createInfo_1.subresourceRange.baseMipLevel = 0;
  createInfo_1.subresourceRange.levelCount = 1;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&imageInfo.imageLayout,deviceInterface,
             device_00,(VkImageViewCreateInfo *)local_308,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_328,(Move *)&imageInfo.imageLayout);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_328.deleter.m_deviceIface;
  data_03.object.m_internal = local_328.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_328.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device = local_328.deleter.m_device;
  data_03.deleter.m_allocator = local_328.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=(&this->m_imageView,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&imageInfo.imageLayout);
  ::vk::Handle<(vk::HandleType)20>::Handle((Handle<(vk::HandleType)20> *)&write.pTexelBufferView,0);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                     (&(this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  imageInfo.sampler.m_internal = pHVar7->m_internal;
  imageInfo.imageView.m_internal._0_4_ = PrepareRenderPassContext::getImageLayout(context);
  local_3a0[0] = 0x23;
  write.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  write._4_4_ = 0;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                     (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  write.pNext = (void *)pHVar8->m_internal;
  write.dstSet.m_internal._0_4_ = 0;
  write.dstSet.m_internal._4_4_ = 0;
  write.dstBinding = 1;
  write.dstArrayElement = 3;
  write._32_8_ = &write.pTexelBufferView;
  write.pImageInfo = (VkDescriptorImageInfo *)0x0;
  write.pBufferInfo = (VkDescriptorBufferInfo *)0x0;
  (*deviceInterface->_vptr_DeviceInterface[0x3e])(deviceInterface,device_00,1,local_3a0,0,0);
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  ~vector((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
           *)&binding.pImmutableSamplers);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_100);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_68);
  return;
}

Assistant:

void RenderVertexStorageImage::prepare (PrepareRenderPassContext& context)
{
	const vk::DeviceInterface&					vkd						= context.getContext().getDeviceInterface();
	const vk::VkDevice							device					= context.getContext().getDevice();
	const vk::VkRenderPass						renderPass				= context.getRenderPass();
	const deUint32								subpass					= 0;
	const vk::Unique<vk::VkShaderModule>		vertexShaderModule		(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("storage-image.vert"), 0));
	const vk::Unique<vk::VkShaderModule>		fragmentShaderModule	(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("render-white.frag"), 0));
	vector<vk::VkDescriptorSetLayoutBinding>	bindings;

	{
		const vk::VkDescriptorSetLayoutBinding binding =
		{
			0u,
			vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
			1,
			vk::VK_SHADER_STAGE_VERTEX_BIT,
			DE_NULL
		};

		bindings.push_back(binding);
	}

	createPipelineWithResources(vkd, device, renderPass, subpass, *vertexShaderModule, *fragmentShaderModule, context.getTargetWidth(), context.getTargetHeight(),
								vector<vk::VkVertexInputBindingDescription>(), vector<vk::VkVertexInputAttributeDescription>(), bindings, vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST, 0u, DE_NULL, m_resources);

	{
		const vk::VkDescriptorPoolSize			poolSizes		=
		{
			vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
			1
		};
		const vk::VkDescriptorPoolCreateInfo	createInfo		=
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
			DE_NULL,
			vk::VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,

			1u,
			1u,
			&poolSizes,
		};

		m_descriptorPool = vk::createDescriptorPool(vkd, device, &createInfo);
	}

	{
		const vk::VkDescriptorSetLayout			layout			= *m_resources.descriptorSetLayout;
		const vk::VkDescriptorSetAllocateInfo	allocateInfo	=
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,

			*m_descriptorPool,
			1,
			&layout
		};

		m_descriptorSet = vk::allocateDescriptorSet(vkd, device, &allocateInfo);

		{
			const vk::VkImageViewCreateInfo createInfo =
			{
				vk::VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,
				DE_NULL,
				0u,

				context.getImage(),
				vk::VK_IMAGE_VIEW_TYPE_2D,
				vk::VK_FORMAT_R8G8B8A8_UNORM,
				vk::makeComponentMappingRGBA(),
				{
					vk::VK_IMAGE_ASPECT_COLOR_BIT,
					0u,
					1u,
					0u,
					1u
				}
			};

			m_imageView = vk::createImageView(vkd, device, &createInfo);
		}

		{
			const vk::VkDescriptorImageInfo			imageInfo	=
			{
				0,
				*m_imageView,
				context.getImageLayout()
			};
			const vk::VkWriteDescriptorSet			write		=
			{
				vk::VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
				DE_NULL,
				*m_descriptorSet,
				0u,
				0u,
				1u,
				vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
				&imageInfo,
				DE_NULL,
				DE_NULL,
			};

			vkd.updateDescriptorSets(device, 1u, &write, 0u, DE_NULL);
		}
	}
}